

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_netstd_generator.cc
# Opt level: O2

string * __thiscall
t_netstd_generator::type_name_abi_cxx11_
          (string *__return_storage_ptr__,t_netstd_generator *this,t_type *ttype,bool with_namespace
          )

{
  t_program *this_00;
  int iVar1;
  t_base_type *tbase;
  undefined4 extraout_var;
  t_netstd_generator *this_01;
  string *this_02;
  t_set *tset;
  string the_name;
  string ns;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  this_01 = this;
  tbase = (t_base_type *)resolve_typedef(ttype);
  iVar1 = (*(tbase->super_t_type).super_t_doc._vptr_t_doc[5])(tbase);
  if ((char)iVar1 != '\0') {
    base_type_name_abi_cxx11_(__return_storage_ptr__,this_01,tbase);
    return __return_storage_ptr__;
  }
  iVar1 = (*(tbase->super_t_type).super_t_doc._vptr_t_doc[0x10])(tbase);
  if ((char)iVar1 != '\0') {
    type_name_abi_cxx11_
              (&local_b0,this,(t_type *)tbase[1].super_t_type.super_t_doc.doc_._M_dataplus._M_p,true
              );
    std::operator+(&local_d0,"Dictionary<",&local_b0);
    std::operator+(&ns,&local_d0,", ");
    type_name_abi_cxx11_
              (&local_70,this,(t_type *)tbase[1].super_t_type.super_t_doc.doc_._M_string_length,true
              );
    std::operator+(&the_name,&ns,&local_70);
    std::operator+(__return_storage_ptr__,&the_name,">");
    std::__cxx11::string::~string((string *)&the_name);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&ns);
    std::__cxx11::string::~string((string *)&local_d0);
    this_02 = &local_b0;
    goto LAB_002445ea;
  }
  iVar1 = (*(tbase->super_t_type).super_t_doc._vptr_t_doc[0xf])(tbase);
  if ((char)iVar1 == '\0') {
    iVar1 = (*(tbase->super_t_type).super_t_doc._vptr_t_doc[0xe])(tbase);
    if ((char)iVar1 == '\0') {
      iVar1 = (*(tbase->super_t_type).super_t_doc._vptr_t_doc[3])(tbase);
      std::__cxx11::string::string((string *)&local_50,(string *)CONCAT44(extraout_var,iVar1));
      normalize_name(&the_name,this,&local_50,false);
      std::__cxx11::string::~string((string *)&local_50);
      if ((with_namespace) &&
         (this_00 = (tbase->super_t_type).program_, this_00 != (t_program *)0x0)) {
        std::__cxx11::string::string((string *)&local_90,"netstd",(allocator *)&local_d0);
        t_program::get_namespace(&ns,this_00,&local_90);
        std::__cxx11::string::~string((string *)&local_90);
        if (ns._M_string_length == 0) {
          std::__cxx11::string::~string((string *)&ns);
          goto LAB_002445a3;
        }
        std::operator+(&local_b0,"global::",&ns);
        std::operator+(&local_d0,&local_b0,".");
        std::operator+(__return_storage_ptr__,&local_d0,&the_name);
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&ns);
      }
      else {
LAB_002445a3:
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)the_name._M_dataplus._M_p == &the_name.field_2) {
          (__return_storage_ptr__->field_2)._M_allocated_capacity =
               CONCAT71(the_name.field_2._M_allocated_capacity._1_7_,
                        the_name.field_2._M_local_buf[0]);
          *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = the_name.field_2._8_8_;
        }
        else {
          (__return_storage_ptr__->_M_dataplus)._M_p = the_name._M_dataplus._M_p;
          (__return_storage_ptr__->field_2)._M_allocated_capacity =
               CONCAT71(the_name.field_2._M_allocated_capacity._1_7_,
                        the_name.field_2._M_local_buf[0]);
        }
        __return_storage_ptr__->_M_string_length = the_name._M_string_length;
        the_name._M_string_length = 0;
        the_name.field_2._M_local_buf[0] = '\0';
        the_name._M_dataplus._M_p = (pointer)&the_name.field_2;
      }
      this_02 = &the_name;
      goto LAB_002445ea;
    }
    type_name_abi_cxx11_
              (&ns,this,(t_type *)tbase[1].super_t_type.super_t_doc.doc_._M_dataplus._M_p,true);
    std::operator+(&the_name,"List<",&ns);
    std::operator+(__return_storage_ptr__,&the_name,">");
  }
  else {
    type_name_abi_cxx11_
              (&ns,this,(t_type *)tbase[1].super_t_type.super_t_doc.doc_._M_dataplus._M_p,true);
    std::operator+(&the_name,"THashSet<",&ns);
    std::operator+(__return_storage_ptr__,&the_name,">");
  }
  std::__cxx11::string::~string((string *)&the_name);
  this_02 = &ns;
LAB_002445ea:
  std::__cxx11::string::~string((string *)this_02);
  return __return_storage_ptr__;
}

Assistant:

string t_netstd_generator::type_name(t_type* ttype, bool with_namespace)
{
    ttype = resolve_typedef(ttype);

    if (ttype->is_base_type())
    {
        return base_type_name(static_cast<t_base_type*>(ttype));
    }

    if (ttype->is_map())
    {
        t_map* tmap = static_cast<t_map*>(ttype);
        return "Dictionary<" + type_name(tmap->get_key_type()) + ", " + type_name(tmap->get_val_type()) + ">";
    }

    if (ttype->is_set())
    {
        t_set* tset = static_cast<t_set*>(ttype);
        return "THashSet<" + type_name(tset->get_elem_type()) + ">";
    }

    if (ttype->is_list())
    {
        t_list* tlist = static_cast<t_list*>(ttype);
        return "List<" + type_name(tlist->get_elem_type()) + ">";
    }

    string the_name = normalize_name(ttype->get_name());

    if(with_namespace)
    {
        t_program* program = ttype->get_program();
        if (program != nullptr)// && program != program_)
        {
            string ns =  program->get_namespace("netstd");
            if (!ns.empty())
            {
                return "global::" + ns + "." + the_name;
            }
        }
    }

    return the_name;
}